

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::getAncestorBaseName_abi_cxx11_(string *__return_storage_ptr__,FBX *this,aiNode *node)

{
  ulong uVar1;
  size_t sVar2;
  bool local_52;
  allocator local_29;
  ulong local_28;
  size_t length;
  char *nodeName;
  aiNode *node_local;
  
  length = 0;
  local_28 = 0;
  nodeName = (char *)this;
  node_local = (aiNode *)__return_storage_ptr__;
  while( true ) {
    sVar2 = length;
    uVar1 = local_28;
    local_52 = false;
    if (nodeName != (char *)0x0) {
      local_52 = length == 0 || local_28 == 0;
    }
    if (!local_52) break;
    length = (size_t)aiString::C_Str((aiString *)nodeName);
    local_28 = (ulong)*(uint *)nodeName;
    nodeName = *(char **)(nodeName + 0x448);
  }
  if ((length == 0) || (local_28 == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)sVar2,uVar1,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getAncestorBaseName(const aiNode* node)
        {
            const char* nodeName = nullptr;
            size_t length = 0;
            while (node && (!nodeName || length == 0))
            {
                nodeName = node->mName.C_Str();
                length = node->mName.length;
                node = node->mParent;
            }

            if (!nodeName || length == 0)
            {
                return {};
            }
            // could be std::string_view if c++17 available
            return std::string(nodeName, length);
        }